

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::HardenedPrintString
          (Printer *this,string_view src,BaseTextGenerator *generator)

{
  Printer *pPVar1;
  byte bVar2;
  int *piVar3;
  ulong uVar4;
  Printer *pPVar5;
  long *plVar6;
  ulong uVar7;
  size_t sVar9;
  Printer *pPVar10;
  Printer *pPVar11;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  Printer *pPVar8;
  
  plVar6 = (long *)src._M_str;
  sVar9 = src._M_len;
  (**(code **)(*plVar6 + 0x28))(plVar6,"\"",1);
  if (this != (Printer *)0x0) {
    do {
      pPVar10 = (Printer *)0x0;
      do {
        bVar2 = *(byte *)((long)&pPVar10->initial_indent_level_ + sVar9);
        if ((char)bVar2 < '\0') {
          pPVar11 = (Printer *)((long)&pPVar10->initial_indent_level_ + 1);
          pPVar5 = pPVar10;
          if (pPVar11 < this) {
            pPVar11 = this;
          }
          do {
            pPVar1 = (Printer *)((long)&pPVar5->initial_indent_level_ + 1);
            pPVar8 = pPVar11;
            if (this <= pPVar1) break;
            piVar3 = &pPVar5->initial_indent_level_;
            pPVar5 = pPVar1;
            pPVar8 = pPVar1;
          } while (*(char *)((long)piVar3 + sVar9 + 1) < '\0');
          uVar7 = (long)pPVar8 - (long)pPVar10;
          uVar4 = (long)this - (long)pPVar10;
          if (uVar7 <= (ulong)((long)this - (long)pPVar10)) {
            uVar4 = uVar7;
          }
          uVar4 = utf8_range::SpanStructurallyValid
                            (uVar4,(long)&pPVar10->initial_indent_level_ + sVar9);
          if (uVar4 != uVar7) {
            pPVar11 = (Printer *)((long)&pPVar10->initial_indent_level_ + uVar4);
            break;
          }
          pPVar10 = (Printer *)((long)pPVar10 + (uVar4 - 1));
        }
        else {
          pPVar11 = pPVar10;
          if ((0x5e < (byte)(bVar2 - 0x20)) ||
             ((bVar2 - 0x22 < 0x3b &&
              ((0x400000000000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)))) break;
        }
        pPVar10 = (Printer *)((long)&pPVar10->initial_indent_level_ + 1);
        pPVar11 = this;
      } while (pPVar10 < this);
      if (pPVar11 != (Printer *)0x0) {
        pPVar10 = pPVar11;
        if (this < pPVar11) {
          pPVar10 = this;
        }
        (**(code **)(*plVar6 + 0x28))(plVar6,sVar9,pPVar10);
        this = (Printer *)((long)this - (long)pPVar11);
        if (this == (Printer *)0x0) break;
        sVar9 = (long)&pPVar11->initial_indent_level_ + sVar9;
      }
      absl::lts_20240722::CEscape_abi_cxx11_(&local_50,1,sVar9);
      (**(code **)(*plVar6 + 0x28))(plVar6,local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      sVar9 = sVar9 + 1;
      this = (Printer *)((long)&this[-1].finder_ + 7);
    } while (this != (Printer *)0x0);
  }
  (**(code **)(*plVar6 + 0x28))(plVar6,"\"",1);
  return;
}

Assistant:

void TextFormat::Printer::HardenedPrintString(
    absl::string_view src, TextFormat::BaseTextGenerator* generator) {
  // Print as UTF-8, while guarding against any invalid UTF-8 in the string
  // field.
  //
  // If in the future we have a guaranteed invariant that invalid UTF-8 will
  // never be present, we could avoid the UTF-8 check here.

  generator->PrintLiteral("\"");
  while (!src.empty()) {
    size_t n = SkipPassthroughBytes(src);
    if (n != 0) {
      generator->PrintString(src.substr(0, n));
      src.remove_prefix(n);
      if (src.empty()) break;
    }

    // If repeated calls to CEscape() and PrintString() are expensive, we could
    // consider batching them, at the cost of some complexity.
    generator->PrintString(absl::CEscape(src.substr(0, 1)));
    src.remove_prefix(1);
  }
  generator->PrintLiteral("\"");
}